

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  string *this;
  int iVar1;
  bool *pbVar2;
  bool bVar3;
  long lVar4;
  StringEntry *pSVar5;
  StringEntry *pSVar6;
  char *pcVar7;
  size_type sVar8;
  size_t sVar9;
  long *plVar10;
  ostream *poVar11;
  undefined1 *puVar12;
  byte bVar13;
  string *psVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  char *se_name [2];
  StringEntry *se [2];
  cmELF elf;
  ostringstream e;
  cmSystemToolsRPathInfo rp [2];
  undefined1 local_388 [4];
  uint local_384;
  ulong local_380;
  string *local_378;
  string *local_370;
  string *local_368;
  StringEntry *local_360;
  string *local_358;
  bool *local_350;
  StringEntry *local_348 [2];
  long local_338 [2];
  cmELF local_328;
  ulong local_300;
  long *local_2f8 [2];
  long local_2e8 [2];
  undefined1 local_2d8 [16];
  _func_int *local_2c8 [2];
  byte abStack_2b8 [80];
  ios_base local_268 [136];
  ios_base local_1e0 [264];
  pointer local_d8 [2];
  ulong local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8 [8];
  ulong local_a0 [11];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar4 = 0xa0;
  puVar12 = local_b8;
  do {
    *(undefined1 **)(puVar12 + -0x10) = puVar12;
    *(undefined8 *)(puVar12 + -8) = 0;
    *puVar12 = 0;
    *(undefined1 **)(puVar12 + 0x10) = puVar12 + 0x20;
    *(undefined8 *)(puVar12 + 0x18) = 0;
    puVar12[0x20] = 0;
    puVar12 = puVar12 + 0x50;
    lVar4 = lVar4 + -0x50;
  } while (lVar4 != 0);
  local_378 = newRPath;
  local_370 = oldRPath;
  cmELF::cmELF(&local_328,(file->_M_dataplus)._M_p);
  local_338[0] = 0;
  local_338[1] = 0;
  local_348[0] = (StringEntry *)0x0;
  local_348[1] = (StringEntry *)0x0;
  pSVar5 = cmELF::GetRPath(&local_328);
  if (pSVar5 != (StringEntry *)0x0) {
    local_348[0] = (StringEntry *)0x4f8ddf;
    local_338[0] = (long)pSVar5;
  }
  uVar17 = (uint)(pSVar5 != (StringEntry *)0x0);
  local_350 = changed;
  pSVar6 = cmELF::GetRunPath(&local_328);
  if (pSVar6 == (StringEntry *)0x0) {
    uVar15 = 1;
    pcVar7 = (char *)0x0;
    if (pSVar5 == (StringEntry *)0x0) {
      bVar3 = local_378->_M_string_length == 0;
      if (emsg != (string *)0x0 && !bVar3) {
        std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x4db3cf);
        std::__cxx11::string::_M_append((char *)emsg,(ulong)local_328.ErrorMessage._M_dataplus._M_p)
        ;
      }
      cmELF::~cmELF(&local_328);
      goto LAB_00176157;
    }
  }
  else {
    uVar15 = (ulong)(uVar17 * 8);
    *(StringEntry **)((long)local_338 + uVar15) = pSVar6;
    pcVar7 = "RUNPATH";
    *(char **)((long)local_348 + uVar15) = "RUNPATH";
    uVar15 = (ulong)(uVar17 + 1);
  }
  local_384 = (uint)CONCAT71((int7)((ulong)pcVar7 >> 8),1);
  uVar16 = 0;
  uVar17 = 0;
  local_300 = uVar15;
  local_368 = emsg;
  local_358 = file;
  do {
    if (uVar17 == 0) {
      psVar14 = (string *)local_338[uVar16];
LAB_00175bcf:
      local_380 = CONCAT44(local_380._4_4_,uVar17);
      sVar8 = cmSystemToolsFindRPath(psVar14,local_370);
      if (sVar8 == 0xffffffffffffffff) {
        sVar8 = cmSystemToolsFindRPath(psVar14,local_378);
        if (sVar8 == 0xffffffffffffffff) {
          if (emsg != (string *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,"The current ",0xc);
            pSVar5 = local_348[uVar16];
            if (pSVar5 == (StringEntry *)0x0) {
              std::ios::clear((int)(local_388 + (long)*(_func_int **)(local_2d8._0_8_ + -0x18)) +
                              0xb0);
            }
            else {
              sVar9 = strlen((char *)pSVar5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,(char *)pSVar5,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8," is:\n",5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"  ",2);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2d8,(psVar14->_M_dataplus)._M_p,
                                 psVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"which does not contain:\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  ",2);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(local_370->_M_dataplus)._M_p,local_370->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"as was expected.",0x10);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)emsg,(string *)local_2f8);
            if (local_2f8[0] != local_2e8) {
              operator_delete(local_2f8[0],local_2e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
            std::ios_base::~ios_base(local_268);
          }
          goto LAB_0017614b;
        }
        local_384 = 0;
        uVar17 = (uint)local_380;
      }
      else {
        lVar4 = (long)(int)(uint)local_380;
        uVar15 = psVar14[1]._M_string_length;
        local_d8[lVar4 * 10] = psVar14[1]._M_dataplus._M_p;
        local_c8[lVar4 * 10 + -1] = uVar15;
        pSVar5 = local_348[uVar16];
        local_360 = (StringEntry *)local_c8[lVar4 * 10 + 1];
        strlen((char *)pSVar5);
        pSVar6 = local_360;
        local_360 = pSVar5;
        std::__cxx11::string::_M_replace
                  ((ulong)(local_c8 + lVar4 * 10),0,(char *)pSVar6,(ulong)pSVar5);
        std::__cxx11::string::substr((ulong)local_2d8,(ulong)psVar14);
        this = local_a8 + lVar4 * 0x50;
        std::__cxx11::string::operator=(this,(string *)local_2d8);
        if ((_func_int **)local_2d8._0_8_ != local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0] + 1));
        }
        std::__cxx11::string::_M_append((char *)this,(ulong)(local_378->_M_dataplus)._M_p);
        std::__cxx11::string::substr((ulong)local_2d8,(ulong)psVar14);
        std::__cxx11::string::_M_append((char *)this,local_2d8._0_8_);
        emsg = local_368;
        iVar1 = (uint)local_380;
        if ((_func_int **)local_2d8._0_8_ != local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0] + 1));
        }
        uVar15 = local_a0[lVar4 * 10];
        if (local_c8[lVar4 * 10 + -1] < uVar15 + 1) {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x4db43f);
            std::__cxx11::string::append((char *)emsg);
            std::__cxx11::string::append((char *)emsg);
          }
LAB_0017614b:
          cmELF::~cmELF(&local_328);
          bVar3 = false;
          goto LAB_00176157;
        }
        local_384 = (uint)CONCAT71((int7)(uVar15 >> 8),uVar15 == 0 & (byte)local_384);
        uVar15 = local_300;
        uVar17 = iVar1 + 1;
      }
    }
    else {
      psVar14 = (string *)local_338[uVar16];
      if (local_d8[0] != psVar14[1]._M_dataplus._M_p) goto LAB_00175bcf;
    }
    uVar16 = uVar16 + 1;
  } while (uVar15 != uVar16);
  cmELF::~cmELF(&local_328);
  bVar3 = true;
  if (uVar17 != 0) {
    if ((local_384 & 1) == 0) {
      std::ofstream::ofstream(local_2d8,(local_358->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
      if ((abStack_2b8[(long)*(_func_int **)(local_2d8._0_8_ + -0x18)] & 5) == 0) {
        if (0 < (int)uVar17) {
          local_380 = (ulong)uVar17;
          uVar15 = 0;
          do {
            plVar10 = (long *)std::ostream::seekp((ostream *)local_2d8,local_d8[uVar15 * 10],0);
            psVar14 = local_368;
            if ((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) {
              if (local_368 == (string *)0x0) {
LAB_0017621e:
                bVar13 = 1;
              }
              else {
                std::__cxx11::string::operator=((string *)local_368,"Error seeking to ");
                std::__cxx11::string::_M_append((char *)psVar14,local_c8[uVar15 * 10]);
LAB_00176212:
                bVar13 = 1;
                std::__cxx11::string::append((char *)psVar14);
              }
              goto LAB_00176220;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,*(char **)(local_a8 + uVar15 * 0x50),
                       local_a0[uVar15 * 10]);
            for (uVar16 = local_a0[uVar15 * 10]; psVar14 = local_368,
                uVar16 < local_c8[uVar15 * 10 + -1]; uVar16 = uVar16 + 1) {
              local_328.Internal._0_1_ = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,(char *)&local_328,1);
            }
            if ((abStack_2b8[(long)*(_func_int **)(local_2d8._0_8_ + -0x18)] & 5) != 0) {
              if (local_368 == (string *)0x0) goto LAB_0017621e;
              std::__cxx11::string::operator=((string *)local_368,"Error writing the new ");
              std::__cxx11::string::_M_append((char *)psVar14,local_c8[uVar15 * 10]);
              goto LAB_00176212;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != local_380);
        }
        bVar13 = 0;
      }
      else {
        bVar13 = 1;
        if (emsg != (string *)0x0) {
          std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x4db471);
        }
      }
LAB_00176220:
      pbVar2 = local_350;
      bVar18 = local_350 == (bool *)0x0;
      local_2d8._0_8_ = _VTT;
      *(undefined8 *)(local_2d8 + (long)_VTT[-3]) = _vtable;
      std::filebuf::~filebuf((filebuf *)(local_2d8 + 8));
      std::ios_base::~ios_base(local_1e0);
      if (bVar18 || bVar13 != 0) {
        bVar3 = (bool)(bVar13 ^ 1);
      }
      else {
        *pbVar2 = true;
      }
    }
    else {
      bVar3 = RemoveRPath(local_358,emsg,local_350);
    }
  }
LAB_00176157:
  lVar4 = -0xa0;
  plVar10 = local_48;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    if (plVar10 + -4 != (long *)plVar10[-6]) {
      operator_delete((long *)plVar10[-6],plVar10[-4] + 1);
    }
    plVar10 = plVar10 + -10;
    lVar4 = lVar4 + 0x50;
  } while (lVar4 != 0);
  return bVar3;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath, std::string* emsg,
                                bool* changed)
{
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    const char* se_name[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      if (newRPath.empty()) {
        // The new rpath is empty and there is no rpath anyway so it is
        // okay.
        return true;
      }
      if (emsg) {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
      }
      return false;
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Make sure the current rpath contains the old rpath.
      std::string::size_type pos =
        cmSystemToolsFindRPath(se[i]->Value, oldRPath);
      if (pos == std::string::npos) {
        // If it contains the new rpath instead then it is okay.
        if (cmSystemToolsFindRPath(se[i]->Value, newRPath) !=
            std::string::npos) {
          remove_rpath = false;
          continue;
        }
        if (emsg) {
          std::ostringstream e;
          /* clang-format off */
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
          /* clang-format on */
          *emsg = e.str();
        }
        return false;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      std::string::size_type prefix_len = pos;

      // If oldRPath was at the end of the file's RPath, and newRPath is empty,
      // we should remove the unnecessary ':' at the end.
      if (newRPath.empty() && pos > 0 && se[i]->Value[pos - 1] == ':' &&
          pos + oldRPath.length() == se[i]->Value.length()) {
        prefix_len--;
      }

      // Construct the new value which preserves the part of the path
      // not being changed.
      rp[rp_count].Value = se[i]->Value.substr(0, prefix_len);
      rp[rp_count].Value += newRPath;
      rp[rp_count].Value += se[i]->Value.substr(pos + oldRPath.length());

      if (!rp[rp_count].Value.empty()) {
        remove_rpath = false;
      }

      // Make sure there is enough room to store the new rpath and at
      // least one null terminator.
      if (rp[rp_count].Size < rp[rp_count].Value.length() + 1) {
        if (emsg) {
          *emsg = "The replacement path is too long for the ";
          *emsg += se_name[i];
          *emsg += " entry.";
        }
        return false;
      }

      // This entry is ready for update.
      ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = "Error seeking to ";
          *emsg += rp[i].Name;
          *emsg += " position.";
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = "Error writing the new ";
          *emsg += rp[i].Name;
          *emsg += " string to the file.";
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
}